

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::setFileName(TSMuxer *this,string *fileName,FileFactory *fileFactory)

{
  string *src;
  string ext;
  string sStack_78;
  string local_58;
  string local_38;
  
  this->m_curFileNum = 0;
  AbstractMuxer::setFileName(&this->super_AbstractMuxer,fileName,fileFactory);
  std::__cxx11::string::string((string *)&local_38,(string *)fileName);
  getNextName(&sStack_78,this,&local_38);
  src = &this->m_outFileName;
  std::__cxx11::string::operator=((string *)src,(string *)&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  extractFileExt(&local_58,src);
  strToUpperCase(&sStack_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  setMuxFormat(this,&sStack_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->m_fileNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_fileNames,src);
  std::__cxx11::string::~string((string *)&sStack_78);
  return;
}

Assistant:

void TSMuxer::setFileName(const std::string& fileName, FileFactory* fileFactory)
{
    m_curFileNum = 0;
    AbstractMuxer::setFileName(fileName, fileFactory);
    m_outFileName = getNextName(fileName);
    const string ext = strToUpperCase(extractFileExt(m_outFileName));
    setMuxFormat(ext);

    m_fileNames.clear();
    m_fileNames.push_back(m_outFileName);
}